

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::~IfcDistributionFlowElementType
          (IfcDistributionFlowElementType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcDistributionElementType).super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeProduct *)
            (&(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &(this->super_IfcDistributionElementType).super_IfcElementType.field_0x168 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x168) = 0x880d78;
  *(undefined8 *)((long)pvVar1 + 0x38) = 0x880e40;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x880da0;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x880dc8;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x880df0;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x880e18;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__00880ad8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcDistributionFlowElementType() : Object("IfcDistributionFlowElementType") {}